

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O2

void Abc_ObjAddFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  int iVar1;
  uint uVar2;
  char *__assertion;
  long *plVar3;
  
  if (((ulong)pObj & 1) == 0) {
    plVar3 = (long *)((ulong)pFanin & 0xfffffffffffffffe);
    if (pObj->pNtk == (Abc_Ntk_t *)*plVar3) {
      if ((pObj->Id < 0) || ((int)plVar3[2] < 0)) {
        __assertion = "pObj->Id >= 0 && pFaninR->Id >= 0";
        uVar2 = 0x59;
      }
      else {
        uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
        if ((uVar2 == 2) || ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 3)) {
          __assertion = "!Abc_ObjIsPi(pObj) && !Abc_ObjIsPo(pFaninR)";
          uVar2 = 0x5a;
        }
        else if (uVar2 - 5 < 0xfffffffe) {
          if ((uVar2 != 6) || ((pObj->vFanins).nSize == 0)) {
LAB_0069f605:
            Vec_IntPushMem(pObj->pNtk->pMmStep,&pObj->vFanins,(int)plVar3[2]);
            Vec_IntPushMem(pObj->pNtk->pMmStep,(Vec_Int_t *)(plVar3 + 5),pObj->Id);
            if (((ulong)pFanin & 1) != 0) {
              iVar1 = (pObj->vFanins).nSize;
              if (1 < iVar1 - 1U) {
                __assert_fail("i >=0 && i < 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                              ,0x17e,"void Abc_ObjSetFaninC(Abc_Obj_t *, int)");
              }
              *(uint *)&pObj->field_0x14 =
                   *(uint *)&pObj->field_0x14 | (uint)(iVar1 != 1) * 0x400 + 0x400;
            }
            return;
          }
          __assertion = "!Abc_ObjIsNet(pObj) || !Abc_ObjFaninNum(pObj)";
          uVar2 = 0x5c;
        }
        else {
          if ((pObj->vFanins).nSize == 0) goto LAB_0069f605;
          __assertion = "!Abc_ObjIsCo(pObj) || !Abc_ObjFaninNum(pObj)";
          uVar2 = 0x5b;
        }
      }
    }
    else {
      __assertion = "pObj->pNtk == pFaninR->pNtk";
      uVar2 = 0x58;
    }
  }
  else {
    __assertion = "!Abc_ObjIsComplement(pObj)";
    uVar2 = 0x57;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                ,uVar2,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_ObjAddFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pFaninR = Abc_ObjRegular(pFanin);
    assert( !Abc_ObjIsComplement(pObj) );
    assert( pObj->pNtk == pFaninR->pNtk );
    assert( pObj->Id >= 0 && pFaninR->Id >= 0 );
    assert( !Abc_ObjIsPi(pObj) && !Abc_ObjIsPo(pFaninR) );    // fanin of PI or fanout of PO
    assert( !Abc_ObjIsCo(pObj) || !Abc_ObjFaninNum(pObj) );  // CO with two fanins
    assert( !Abc_ObjIsNet(pObj) || !Abc_ObjFaninNum(pObj) ); // net with two fanins
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pObj->vFanins,     pFaninR->Id );
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pFaninR->vFanouts, pObj->Id    );
    if ( Abc_ObjIsComplement(pFanin) )
        Abc_ObjSetFaninC( pObj, Abc_ObjFaninNum(pObj)-1 );
}